

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void lexer_IncIFDepth(void)

{
  IfStack *pIVar1;
  int *piVar2;
  char *pcVar3;
  IfStack *ifStack;
  
  pIVar1 = (IfStack *)malloc(0x10);
  if (pIVar1 == (IfStack *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fatalerror("Unable to allocate new IF depth: %s\n",pcVar3);
  }
  pIVar1->ranIfBlock = false;
  pIVar1->reachedElseBlock = false;
  pIVar1->next = lexerState->ifStack;
  lexerState->ifStack = pIVar1;
  return;
}

Assistant:

void lexer_IncIFDepth(void)
{
	struct IfStack *ifStack = (struct IfStack *)malloc(sizeof(*ifStack));

	if (!ifStack)
		fatalerror("Unable to allocate new IF depth: %s\n", strerror(errno));

	ifStack->ranIfBlock = false;
	ifStack->reachedElseBlock = false;
	ifStack->next = lexerState->ifStack;

	lexerState->ifStack = ifStack;
}